

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo.c
# Opt level: O0

int run_loop(int fd,quicly_conn_t *client)

{
  _func_int64_t_st_quicly_now_t_ptr *p_Var1;
  int iVar2;
  int64_t iVar3;
  int64_t iVar4;
  int *piVar5;
  ssize_t sVar6;
  ulong uVar7;
  ulong uVar8;
  uint *puVar9;
  bool bVar10;
  uint local_1ad8;
  bool local_1ad1;
  ulong local_1ad0;
  bool local_1ac5;
  int local_1ac4;
  long local_1ac0;
  size_t j;
  long lStack_1ab0;
  int ret;
  size_t num_dgrams;
  unsigned_long __vla_expr0;
  iovec dgrams [10];
  quicly_address_t src;
  quicly_address_t dest;
  ssize_t rret;
  msghdr msg;
  iovec vec;
  sockaddr_storage sa;
  uint8_t buf [4096];
  fd_set *__arr;
  long lStack_8d8;
  uint __i;
  int64_t delta;
  int64_t conn_timeout;
  int64_t now;
  int64_t first_timeout;
  timeval tv;
  fd_set readfds;
  long lStack_820;
  int read_stdin;
  size_t i;
  quicly_conn_t *conns [256];
  quicly_conn_t *client_local;
  int fd_local;
  
  puVar9 = &local_1ad8;
  conns[0xff] = client;
  memset(&i,0,0x800);
  i = (size_t)conns[0xff];
  bVar10 = conns[0xff] != (quicly_conn_t *)0x0;
  do {
    do {
      now = 0x7fffffffffffffff;
      p_Var1 = (ctx.now)->cb;
      *(undefined8 *)((long)puVar9 + -8) = 0x12c0d9;
      iVar3 = (*p_Var1)(ctx.now);
      for (lStack_820 = 0; conns[lStack_820 + -1] != (quicly_conn_t *)0x0;
          lStack_820 = lStack_820 + 1) {
        *(undefined8 *)((long)puVar9 + -8) = 0x12c111;
        iVar4 = quicly_get_first_timeout(*(quicly_conn_t **)((long)puVar9 + 0x10));
        if (iVar4 < now) {
          now = iVar4;
        }
      }
      if (iVar3 < now) {
        lStack_8d8 = now - iVar3;
        if (1000000 < lStack_8d8) {
          lStack_8d8 = 1000000;
        }
        first_timeout = lStack_8d8 / 1000;
        tv.tv_sec = (lStack_8d8 % 1000) * 1000;
      }
      else {
        first_timeout = 1000;
        tv.tv_sec = 0;
      }
      for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
        readfds.fds_bits[(ulong)__arr._4_4_ - 1] = 0;
      }
      readfds.fds_bits[(long)(fd / 0x40) + -1] =
           1L << ((byte)((long)fd % 0x40) & 0x3f) | readfds.fds_bits[(long)(fd / 0x40) + -1];
      if (bVar10) {
        tv.tv_usec = tv.tv_usec | 1;
      }
      *(undefined8 *)((long)puVar9 + -8) = 0x12c29a;
      iVar2 = select(fd + 1,(fd_set *)&tv.tv_usec,(fd_set *)0x0,(fd_set *)0x0,
                     (timeval *)&first_timeout);
      local_1ac5 = false;
      if (iVar2 == -1) {
        *(undefined8 *)((long)puVar9 + -8) = 0x12c2ae;
        piVar5 = __errno_location();
        local_1ac5 = *piVar5 == 4;
      }
    } while (local_1ac5 != false);
    local_1ad0 = readfds.fds_bits[(long)(fd / 0x40) + -1];
    if ((readfds.fds_bits[(long)(fd / 0x40) + -1] & 1L << ((byte)((long)fd % 0x40) & 0x3f)) != 0) {
      msg._48_8_ = &sa.__ss_align;
      vec.iov_base = (void *)0x1000;
      rret = (ssize_t)&vec.iov_len;
      msg.msg_name._0_4_ = 0x80;
      msg._8_8_ = &msg.msg_flags;
      msg.msg_iov = (iovec *)0x1;
      msg.msg_iovlen = 0;
      msg.msg_control = (void *)0x0;
      msg.msg_controllen._0_4_ = 0;
      do {
        *(undefined8 *)((long)puVar9 + -8) = 0x12c38b;
        sVar6 = recvmsg(fd,(msghdr *)&rret,0);
        local_1ad1 = false;
        if (sVar6 == -1) {
          *(undefined8 *)((long)puVar9 + -8) = 0x12c3a8;
          piVar5 = __errno_location();
          local_1ad1 = *piVar5 == 4;
        }
      } while (local_1ad1 != false);
      if (0 < sVar6) {
        *(undefined8 *)((long)puVar9 + -8) = 0x12c3f3;
        process_msg(*(int *)((long)puVar9 + 0xbc),*(quicly_conn_t ***)((long)puVar9 + 0xb0),
                    *(msghdr **)((long)puVar9 + 0xa8),*(size_t *)((long)puVar9 + 0xa0));
      }
    }
    if ((tv.tv_usec & 1U) != 0) {
      if (conns[0xff] == (quicly_conn_t *)0x0) {
        *(undefined8 *)((long)puVar9 + -8) = 0x12c42e;
        __assert_fail("client != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/examples/echo.c"
                      ,0xf3,"int run_loop(int, quicly_conn_t *)");
      }
      *(undefined8 *)((long)puVar9 + -8) = 0x12c437;
      iVar2 = forward_stdin(*(quicly_conn_t **)((long)puVar9 + 0x1010));
      if (iVar2 == 0) {
        bVar10 = false;
      }
    }
    for (lStack_820 = 0; conns[lStack_820 + -1] != (quicly_conn_t *)0x0; lStack_820 = lStack_820 + 1
        ) {
      __vla_expr0 = (unsigned_long)puVar9;
      uVar7 = ctx.transport_params.max_udp_payload_size * 10 + 0xf & 0xfffffffffffffff0;
      num_dgrams = ctx.transport_params.max_udp_payload_size * 10;
      lStack_1ab0 = 10;
      *(uint64_t *)((long)puVar9 + (-0x10 - uVar7)) = ctx.transport_params.max_udp_payload_size * 10
      ;
      *(undefined8 *)((long)puVar9 + (-0x18 - uVar7)) = 0x12c4df;
      local_1ad8 = quicly_send(*(quicly_conn_t **)((long)puVar9 + (0xb8 - uVar7)),
                               *(quicly_address_t **)((long)puVar9 + (0xb0 - uVar7)),
                               *(quicly_address_t **)((long)puVar9 + (0xa8 - uVar7)),
                               *(iovec **)((long)puVar9 + (0xa0 - uVar7)),
                               *(size_t **)((long)puVar9 + (0x98 - uVar7)),
                               *(void **)((long)puVar9 + (0x90 - uVar7)),
                               *(size_t *)((long)puVar9 + (200 - uVar7)));
      j._4_4_ = local_1ad8;
      if (local_1ad8 == 0) {
        for (local_1ac0 = 0; local_1ac0 != lStack_1ab0; local_1ac0 = local_1ac0 + 1) {
          *(undefined8 *)((long)puVar9 + (-8 - uVar7)) = 0x12c54c;
          send_one(*(int *)((long)puVar9 + (0x4c - uVar7)),
                   *(sockaddr **)((long)puVar9 + (0x40 - uVar7)),
                   *(iovec **)((long)puVar9 + (0x38 - uVar7)));
        }
LAB_0012c625:
        local_1ac4 = 0;
      }
      else if (local_1ad8 == 0xff03) {
        *(undefined8 *)((long)puVar9 + (-8 - uVar7)) = 0x12c579;
        quicly_free(*(quicly_conn_t **)((long)puVar9 + (8 - uVar7)));
        *(undefined8 *)((long)puVar9 + (-8 - uVar7)) = 0x12c5c3;
        memmove(conns + lStack_820 + -1,conns + lStack_820,(lStack_820 + 1) * -8 + 0x800);
        lStack_820 = lStack_820 + -1;
        *(undefined8 *)((long)puVar9 + (-8 - uVar7)) = 0x12c5da;
        iVar2 = is_server();
        if (iVar2 != 0) goto LAB_0012c625;
        client_local._4_4_ = 0;
        local_1ac4 = 1;
      }
      else {
        uVar8 = (ulong)local_1ad8;
        *(undefined8 *)((long)puVar9 + (-8 - uVar7)) = 0x12c612;
        fprintf(_stderr,"quicly_send returned %d\n",uVar8);
        client_local._4_4_ = 1;
        local_1ac4 = 1;
      }
      if (local_1ac4 != 0) {
        return client_local._4_4_;
      }
      puVar9 = (uint *)__vla_expr0;
    }
  } while( true );
}

Assistant:

static int run_loop(int fd, quicly_conn_t *client)
{
    quicly_conn_t *conns[256] = {client}; /* a null-terminated list of connections; proper app should use a hashmap or something */
    size_t i;
    int read_stdin = client != NULL;

    while (1) {

        /* wait for sockets to become readable, or some event in the QUIC stack to fire */
        fd_set readfds;
        struct timeval tv;
        do {
            int64_t first_timeout = INT64_MAX, now = ctx.now->cb(ctx.now);
            for (i = 0; conns[i] != NULL; ++i) {
                int64_t conn_timeout = quicly_get_first_timeout(conns[i]);
                if (conn_timeout < first_timeout)
                    first_timeout = conn_timeout;
            }
            if (now < first_timeout) {
                int64_t delta = first_timeout - now;
                if (delta > 1000 * 1000)
                    delta = 1000 * 1000;
                tv.tv_sec = delta / 1000;
                tv.tv_usec = (delta % 1000) * 1000;
            } else {
                tv.tv_sec = 1000;
                tv.tv_usec = 0;
            }
            FD_ZERO(&readfds);
            FD_SET(fd, &readfds);
            /* we want to read input from stdin */
            if (read_stdin)
                FD_SET(0, &readfds);
        } while (select(fd + 1, &readfds, NULL, NULL, &tv) == -1 && errno == EINTR);

        /* read the QUIC fd */
        if (FD_ISSET(fd, &readfds)) {
            uint8_t buf[4096];
            struct sockaddr_storage sa;
            struct iovec vec = {.iov_base = buf, .iov_len = sizeof(buf)};
            struct msghdr msg = {.msg_name = &sa, .msg_namelen = sizeof(sa), .msg_iov = &vec, .msg_iovlen = 1};
            ssize_t rret;
            while ((rret = recvmsg(fd, &msg, 0)) == -1 && errno == EINTR)
                ;
            if (rret > 0)
                process_msg(client != NULL, conns, &msg, rret);
        }

        /* read stdin, send the input to the active stram */
        if (FD_ISSET(0, &readfds)) {
            assert(client != NULL);
            if (!forward_stdin(client))
                read_stdin = 0;
        }

        /* send QUIC packets, if any */
        for (i = 0; conns[i] != NULL; ++i) {
            quicly_address_t dest, src;
            struct iovec dgrams[10];
            uint8_t dgrams_buf[PTLS_ELEMENTSOF(dgrams) * ctx.transport_params.max_udp_payload_size];
            size_t num_dgrams = PTLS_ELEMENTSOF(dgrams);
            int ret = quicly_send(conns[i], &dest, &src, dgrams, &num_dgrams, dgrams_buf, sizeof(dgrams_buf));
            switch (ret) {
            case 0: {
                size_t j;
                for (j = 0; j != num_dgrams; ++j) {
                    send_one(fd, &dest.sa, &dgrams[j]);
                }
            } break;
            case QUICLY_ERROR_FREE_CONNECTION:
                /* connection has been closed, free, and exit when running as a client */
                quicly_free(conns[i]);
                memmove(conns + i, conns + i + 1, sizeof(conns) - sizeof(conns[0]) * (i + 1));
                --i;
                if (!is_server())
                    return 0;
                break;
            default:
                fprintf(stderr, "quicly_send returned %d\n", ret);
                return 1;
            }
        }
    }

    return 0;
}